

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O3

void (anonymous_namespace)::buildCommand((anonymous_namespace)::BuildContext&,llbuild::ninja::
     Command*)::NinjaCommandTask::writeDescription((anonymous_namespace)::BuildContext&,llbuild::
     ninja::Command__(BuildContext *context,Command *command)

{
  llvm lVar1;
  size_type sVar2;
  Command *pCVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  char *__format;
  uint uVar7;
  llvm *plVar8;
  long **fmt;
  char cVar9;
  unsigned_long_long *in_R8;
  llvm *this;
  llvm *plVar10;
  double dVar11;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  char buf [64];
  string s;
  long *local_a8;
  uint local_a0;
  long local_98 [7];
  long local_60;
  Command *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_60 = 0x70;
  if (context->verbose == false) {
    local_60 = (ulong)((command->description)._M_string_length != 0) * 0x20 + 0x70;
  }
  context->numOutputDescriptions = context->numOutputDescriptions + 1;
  plVar8 = (llvm *)(context->statusLinePrefixFormat)._M_dataplus._M_p;
  sVar2 = (context->statusLinePrefixFormat)._M_string_length;
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  fmt = (long **)(sVar2 * 4);
  local_58 = command;
  std::__cxx11::string::reserve((ulong)&local_50);
  if (sVar2 == 0) {
LAB_0012bf71:
    pCVar3 = local_58;
    anon_unknown.dwarf_b0fca::BuildContext::emitStatus
              (context,(char *)fmt,local_50,
               *(undefined8 *)
                ((long)&(local_58->super_JobDescriptor)._vptr_JobDescriptor + local_60));
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    if (pCVar3->executionPool ==
        ((context->manifest)._M_t.
         super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
         ._M_t.
         super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
         .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl)->consolePool) {
      llbuild::commands::CommandLineStatusOutput::finishLine(&context->statusOutput);
    }
    return;
  }
  plVar10 = plVar8 + sVar2;
LAB_0012b9a4:
  lVar1 = *plVar8;
  cVar9 = (char)&local_50;
  if (lVar1 != (llvm)0x5c) {
    if (lVar1 != (llvm)0x25) {
      fmt = (long **)(ulong)(uint)(int)(char)lVar1;
      this = plVar8;
      goto LAB_0012ba91;
    }
    this = plVar8 + 1;
    if (this == plVar10) goto LAB_0012bf64;
    lVar1 = *this;
    switch(lVar1) {
    case (llvm)0x63:
    case (llvm)0x6f:
      lVar5 = std::chrono::_V2::steady_clock::now();
      dVar11 = ((double)context->numOutputDescriptions * 1000.0) /
               (double)((lVar5 - (context->buildStartTime).__d.__r) / 1000000);
      __format = "%.1f";
      goto LAB_0012bd64;
    case (llvm)0x64:
    case (llvm)0x67:
    case (llvm)0x68:
    case (llvm)0x69:
    case (llvm)0x6a:
    case (llvm)0x6b:
    case (llvm)0x6c:
    case (llvm)0x6d:
    case (llvm)0x6e:
    case (llvm)0x71:
      goto switchD_0012b9e7_caseD_64;
    case (llvm)0x65:
      lVar5 = std::chrono::_V2::steady_clock::now();
      dVar11 = (double)((lVar5 - (context->buildStartTime).__d.__r) / 1000000) / 1000.0;
      __format = "%.3f";
LAB_0012bd64:
      snprintf((char *)&local_a8,0x40,__format,dVar11);
LAB_0012bd6b:
      fmt = &local_a8;
      std::__cxx11::string::append((char *)&local_50);
      goto LAB_0012bf53;
    case (llvm)0x66:
      uVar7 = context->numOutputDescriptions;
      cVar9 = '\x01';
      if (9 < uVar7) {
        cVar9 = '\x04';
        uVar6 = uVar7;
        do {
          if (uVar6 < 100) goto LAB_0012beab;
          if (uVar6 < 1000) goto LAB_0012beb0;
          if (uVar6 < 10000) goto LAB_0012beb2;
          cVar9 = cVar9 + '\x04';
          bVar4 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
        } while (bVar4);
LAB_0012bdeb:
        cVar9 = cVar9 + -3;
      }
      break;
    case (llvm)0x70:
      snprintf((char *)&local_a8,0x40,"%3ld%%",
               (ulong)(context->numOutputDescriptions * 100) /
               (ulong)(((context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i +
                       (context->numCommandsCompleted).super___atomic_base<unsigned_int>._M_i) -
                      ((context->numCommandsUpdated).super___atomic_base<unsigned_int>._M_i +
                      (context->numCommandsUpToDate).super___atomic_base<unsigned_int>._M_i)));
      goto LAB_0012bd6b;
    case (llvm)0x72:
      uVar7 = (context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i;
      cVar9 = '\x01';
      if (9 < uVar7) {
        cVar9 = '\x04';
        uVar6 = uVar7;
        do {
          if (uVar6 < 100) goto LAB_0012beab;
          if (uVar6 < 1000) goto LAB_0012beb0;
          if (uVar6 < 10000) goto LAB_0012beb2;
          cVar9 = cVar9 + '\x04';
          bVar4 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
        } while (bVar4);
        goto LAB_0012bdeb;
      }
      break;
    case (llvm)0x73:
      uVar7 = (context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i;
      cVar9 = '\x01';
      if (9 < uVar7) {
        cVar9 = '\x04';
        uVar6 = uVar7;
        do {
          if (uVar6 < 100) goto LAB_0012beab;
          if (uVar6 < 1000) goto LAB_0012beb0;
          if (uVar6 < 10000) goto LAB_0012beb2;
          cVar9 = cVar9 + '\x04';
          bVar4 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
        } while (bVar4);
        goto LAB_0012bdeb;
      }
      break;
    case (llvm)0x74:
      uVar7 = ((context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i +
              (context->numCommandsCompleted).super___atomic_base<unsigned_int>._M_i) -
              ((context->numCommandsUpdated).super___atomic_base<unsigned_int>._M_i +
              (context->numCommandsUpToDate).super___atomic_base<unsigned_int>._M_i);
      cVar9 = '\x01';
      if (9 < uVar7) {
        cVar9 = '\x04';
        uVar6 = uVar7;
        do {
          if (uVar6 < 100) goto LAB_0012beab;
          if (uVar6 < 1000) goto LAB_0012beb0;
          if (uVar6 < 10000) goto LAB_0012beb2;
          cVar9 = cVar9 + '\x04';
          bVar4 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
        } while (bVar4);
        goto LAB_0012bdeb;
      }
      break;
    case (llvm)0x75:
      uVar7 = ((context->numCommandsScanning).super___atomic_base<unsigned_int>._M_i +
              (context->numCommandsCompleted).super___atomic_base<unsigned_int>._M_i) -
              ((context->numCommandsUpdated).super___atomic_base<unsigned_int>._M_i +
               (context->numCommandsUpToDate).super___atomic_base<unsigned_int>._M_i +
              context->numOutputDescriptions);
      cVar9 = '\x01';
      if (9 < uVar7) {
        cVar9 = '\x04';
        uVar6 = uVar7;
        do {
          if (uVar6 < 100) goto LAB_0012beab;
          if (uVar6 < 1000) goto LAB_0012beb0;
          if (uVar6 < 10000) goto LAB_0012beb2;
          cVar9 = cVar9 + '\x04';
          bVar4 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
        } while (bVar4);
        goto LAB_0012bdeb;
      }
      break;
    default:
      if (lVar1 == (llvm)0x25) {
        fmt = (long **)0x25;
        goto LAB_0012ba91;
      }
      goto switchD_0012b9e7_caseD_64;
    }
    goto LAB_0012beb2;
  }
  this = plVar8 + 1;
  if (this != plVar10) {
    lVar1 = *this;
    switch(lVar1) {
    case (llvm)0x5c:
      fmt = (long **)0x5c;
      break;
    case (llvm)0x5d:
    case (llvm)0x5e:
    case (llvm)0x5f:
    case (llvm)0x60:
    case (llvm)0x63:
    case (llvm)0x64:
switchD_0012ba7c_caseD_6f:
      std::__cxx11::string::push_back(cVar9);
      fmt = (long **)(ulong)(uint)(int)(char)lVar1;
      break;
    case (llvm)0x61:
      fmt = (long **)0x7;
      break;
    case (llvm)0x62:
      fmt = (long **)0x8;
      break;
    case (llvm)0x65:
      fmt = (long **)0x1b;
      break;
    case (llvm)0x66:
      fmt = (long **)0xc;
      break;
    default:
      uVar7 = (uint)&local_a8;
      switch(lVar1) {
      case (llvm)0x6e:
        fmt = (long **)0xa;
        break;
      case (llvm)0x6f:
      case (llvm)0x70:
      case (llvm)0x71:
      case (llvm)0x73:
      case (llvm)0x75:
      case (llvm)0x77:
        goto switchD_0012ba7c_caseD_6f;
      case (llvm)0x72:
        fmt = (long **)0xd;
        break;
      case (llvm)0x74:
        fmt = (long **)0x9;
        break;
      case (llvm)0x76:
        fmt = (long **)0xb;
        break;
      case (llvm)0x78:
        if ((((long)plVar10 - (long)this < 3) ||
            (Str_00.Length = 0x10, Str_00.Data = (char *)0x2,
            bVar4 = llvm::getAsUnsignedInteger(plVar8 + 2,Str_00,uVar7,in_R8), bVar4)) ||
           ((long *)0xff < local_a8)) {
          std::__cxx11::string::push_back(cVar9);
          fmt = (long **)0x78;
          break;
        }
        fmt = (long **)(ulong)(uint)(int)(char)local_a8;
        std::__cxx11::string::push_back(cVar9);
        this = plVar8 + 3;
        goto LAB_0012bf53;
      default:
        if (lVar1 != (llvm)0x30) goto switchD_0012ba7c_caseD_6f;
        if (3 < (long)plVar10 - (long)this) {
          Str.Length = 8;
          Str.Data = (char *)0x3;
          bVar4 = llvm::getAsUnsignedInteger(plVar8 + 2,Str,uVar7,in_R8);
          if ((bVar4) || ((long *)0xff < local_a8)) goto LAB_0012bf08;
          this = plVar8 + 4;
LAB_0012bf31:
          fmt = (long **)(ulong)(uint)(int)(char)local_a8;
          goto LAB_0012ba91;
        }
        if ((long)plVar10 - (long)this == 3) {
LAB_0012bf08:
          Str_01.Length = 8;
          Str_01.Data = (char *)0x3;
          bVar4 = llvm::getAsUnsignedInteger(this,Str_01,uVar7,in_R8);
          if ((!bVar4) && (local_a8 < (long *)0x100)) {
            this = plVar8 + 3;
            goto LAB_0012bf31;
          }
        }
        std::__cxx11::string::push_back(cVar9);
        fmt = (long **)0x30;
      }
    }
    std::__cxx11::string::push_back(cVar9);
    goto LAB_0012bf53;
  }
LAB_0012bf64:
  fmt = (long **)(ulong)(uint)(int)(char)lVar1;
  std::__cxx11::string::push_back((char)&local_50);
  goto LAB_0012bf71;
LAB_0012beab:
  cVar9 = cVar9 + -2;
  goto LAB_0012beb2;
LAB_0012beb0:
  cVar9 = cVar9 + -1;
LAB_0012beb2:
  local_a8 = local_98;
  std::__cxx11::string::_M_construct((ulong)&local_a8,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a8,local_a0,uVar7);
  fmt = (long **)local_a8;
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_a8);
  if (local_a8 != local_98) {
    fmt = (long **)(local_98[0] + 1);
    operator_delete(local_a8,(ulong)fmt);
  }
LAB_0012bf53:
  plVar8 = this + 1;
  if (plVar8 == plVar10) goto LAB_0012bf71;
  goto LAB_0012b9a4;
switchD_0012b9e7_caseD_64:
  std::__cxx11::string::push_back(cVar9);
  fmt = (long **)(ulong)(uint)(int)(char)lVar1;
LAB_0012ba91:
  std::__cxx11::string::push_back(cVar9);
  goto LAB_0012bf53;
}

Assistant:

static void writeDescription(BuildContext& context,
                                 ninja::Command* command) {
      const std::string& description =
        context.verbose ? command->getCommandString() :
        command->getEffectiveDescription();
      ++context.numOutputDescriptions;
      context.emitStatus("%s%s",
        context.statusLinePrefix(context.statusLinePrefixFormat).c_str(),
        description.c_str());

      // Whenever we write a description for a console job, make sure to finish
      // the output under the expectation that the console job might write to
      // the output. We don't make any attempt to lock this in case the console
      // job can run concurrently with anything else.
      if (command->getExecutionPool() == context.manifest->getConsolePool()) {
        context.statusOutput.finishLine();
      }
    }